

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::format_uint<1u,char,fmt::v9::appender,unsigned_int>
                   (appender out,uint value,int num_digits,bool upper)

{
  char *buffer_00;
  byte in_CL;
  int in_EDX;
  uint in_ESI;
  buffer<char> *in_RDI;
  char buffer [33];
  char *ptr;
  char *in_stack_ffffffffffffff98;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_stack_ffffffffffffffb8;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_8;
  
  to_unsigned<int>(0);
  buffer_00 = to_pointer<char>((buffer_appender<char>)in_stack_ffffffffffffffb8.container,
                               in_stack_ffffffffffffffb0);
  if (buffer_00 == (char *)0x0) {
    format_uint<1u,char,unsigned_int>(&stack0xffffffffffffffa8,in_ESI,in_EDX,(bool)(in_CL & 1));
    local_8.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v9::appender>
                   (in_RDI,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa8.container);
  }
  else {
    format_uint<1u,char,unsigned_int>(buffer_00,in_ESI,in_EDX,(bool)(in_CL & 1));
    local_8.container = in_RDI;
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_8.container;
}

Assistant:

inline auto format_uint(It out, UInt value, int num_digits, bool upper = false)
    -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}